

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O2

int calculate_non_zero_count(__m128i mask)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [16];
  
  auVar1 = vpshufd_avx(in_ZMM0._0_16_,0xee);
  auVar1 = vpmaxsw_avx(auVar1,in_ZMM0._0_16_);
  auVar3 = vpshufd_avx(auVar1,1);
  auVar1 = vpmaxsw_avx(auVar3,auVar1);
  auVar3 = vpsrld_avx(auVar1,0x10);
  auVar1 = vpmaxsw_avx(auVar1,auVar3);
  iVar2 = vpextrw_avx(auVar1,0);
  return iVar2 + 1;
}

Assistant:

static inline int calculate_non_zero_count(__m128i mask) {
  __m128i mask0, mask1;
  int non_zero_count = 0;
  mask0 = _mm_unpackhi_epi64(mask, mask);
  mask1 = _mm_max_epi16(mask0, mask);
  mask0 = _mm_shuffle_epi32(mask1, 1);
  mask0 = _mm_max_epi16(mask0, mask1);
  mask1 = _mm_srli_epi32(mask0, 16);
  mask0 = _mm_max_epi16(mask0, mask1);
  non_zero_count = _mm_extract_epi16(mask0, 0) + 1;

  return non_zero_count;
}